

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O1

void Gia_ManBuiltInSimStart(Gia_Man_t *p,int nWords,int nObjs)

{
  uint uVar1;
  Vec_Wrd_t *pVVar2;
  word *pwVar3;
  word Entry;
  int iVar4;
  ulong uVar5;
  size_t __size;
  int iVar6;
  
  if (p->fBuiltInSim != 0) {
    __assert_fail("!p->fBuiltInSim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x30b,"void Gia_ManBuiltInSimStart(Gia_Man_t *, int, int)");
  }
  if (p->nObjs != p->vCis->nSize + p->vCos->nSize + 1) {
    __assert_fail("Gia_ManAndNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x30c,"void Gia_ManBuiltInSimStart(Gia_Man_t *, int, int)");
  }
  p->fBuiltInSim = 1;
  p->iPatsPi = 0;
  p->iPastPiMax = 0;
  p->nSimWordsMax = 8;
  p->nSimWords = nWords;
  Gia_ManRandomW(1);
  uVar1 = p->nSimWords;
  uVar5 = (long)p->vCis->nSize * (long)(int)uVar1;
  pVVar2 = (Vec_Wrd_t *)malloc(0x10);
  iVar4 = (int)uVar5;
  iVar6 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar6 = iVar4;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar6;
  if (iVar6 == 0) {
    pwVar3 = (word *)0x0;
  }
  else {
    pwVar3 = (word *)malloc((long)iVar6 << 3);
  }
  pVVar2->pArray = pwVar3;
  p->vSimsPi = pVVar2;
  if (iVar6 < iVar4) {
    if (pwVar3 == (word *)0x0) {
      pwVar3 = (word *)malloc(uVar5 * 8);
    }
    else {
      pwVar3 = (word *)realloc(pwVar3,uVar5 * 8);
    }
    pVVar2->pArray = pwVar3;
    if (pwVar3 == (word *)0x0) goto LAB_00227158;
    pVVar2->nCap = iVar4;
  }
  if (0 < iVar4) {
    memset(pVVar2->pArray,0,(uVar5 & 0xffffffff) << 3);
  }
  pVVar2->nSize = iVar4;
  pVVar2 = (Vec_Wrd_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < nObjs * uVar1 - 1) {
    iVar4 = nObjs * uVar1;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar4;
  if (iVar4 == 0) {
    pwVar3 = (word *)0x0;
  }
  else {
    pwVar3 = (word *)malloc((long)iVar4 << 3);
  }
  pVVar2->pArray = pwVar3;
  p->vSims = pVVar2;
  if (iVar4 < (int)uVar1) {
    __size = (long)(int)uVar1 << 3;
    if (pwVar3 == (word *)0x0) {
      pwVar3 = (word *)malloc(__size);
    }
    else {
      pwVar3 = (word *)realloc(pwVar3,__size);
    }
    pVVar2->pArray = pwVar3;
    if (pwVar3 == (word *)0x0) {
LAB_00227158:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                    ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    pVVar2->nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset(pVVar2->pArray,0,(ulong)uVar1 * 8);
  }
  pVVar2->nSize = uVar1;
  if (0 < p->vCis->nSize) {
    iVar4 = 0;
    do {
      if (0 < p->nSimWords) {
        iVar6 = 0;
        do {
          pVVar2 = p->vSims;
          Entry = Gia_ManRandomW(0);
          Vec_WrdPush(pVVar2,Entry);
          iVar6 = iVar6 + 1;
        } while (iVar6 < p->nSimWords);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < p->vCis->nSize);
  }
  return;
}

Assistant:

void Gia_ManBuiltInSimStart( Gia_Man_t * p, int nWords, int nObjs )
{
    int i, k;
    assert( !p->fBuiltInSim );
    assert( Gia_ManAndNum(p) == 0 );
    p->fBuiltInSim = 1;
    p->iPatsPi = 0;
    p->iPastPiMax = 0;
    p->nSimWords = nWords;
    p->nSimWordsMax = 8;
    Gia_ManRandomW( 1 );
    // init PI care info
    p->vSimsPi = Vec_WrdAlloc( p->nSimWords * Gia_ManCiNum(p) );
    Vec_WrdFill( p->vSimsPi, p->nSimWords * Gia_ManCiNum(p), 0 );
    // init object sim info
    p->vSims = Vec_WrdAlloc( p->nSimWords * nObjs );
    Vec_WrdFill( p->vSims, p->nSimWords, 0 );
    for ( i = 0; i < Gia_ManCiNum(p); i++ )
        for ( k = 0; k < p->nSimWords; k++ )
            Vec_WrdPush( p->vSims, Gia_ManRandomW(0) );
}